

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  _Base_ptr p_Var1;
  bool bVar2;
  long lVar3;
  string_view source_file;
  undefined1 *puVar4;
  _Variant_base<bilingual_str,_wallet::SelectionResult> *p_Var5;
  undefined1 *puVar6;
  int iVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Logger *pLVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar11;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  OutputGroup *group;
  pointer pOVar12;
  pointer pOVar13;
  bool bVar14;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  long lVar15;
  pointer pOVar16;
  long in_FS_OFFSET;
  bool bVar17;
  string_view str;
  string_view logging_function;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  string log_message;
  string log_msg;
  int in_stack_fffffffffffffb60;
  long local_470;
  long local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> local_418;
  optional<wallet::OutputGroup> local_3f8;
  undefined1 local_388 [112];
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [120];
  undefined8 uStack_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined1 uStack_250;
  undefined4 uStack_24f;
  undefined2 uStack_24b;
  undefined1 uStack_249;
  undefined8 *local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [112];
  undefined1 local_1b8 [112];
  SelectionResult local_148;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148.m_target = *nTargetValue;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_148 + 8);
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148.m_algo = 1;
  local_148.m_use_effective = false;
  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_148.m_algo_completed = true;
  local_148.m_weight = 0;
  local_148.bump_fee_group_discount = 0;
  local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
  super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.field_2._8_8_ = 0;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish,rng);
  pOVar13 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pOVar12 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_470 = local_438.field_2._8_8_;
  bVar17 = pOVar13 == pOVar12;
  if (bVar17) {
    bVar14 = false;
  }
  else {
    puVar6 = local_1b8 + 8;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    bVar14 = false;
    do {
      if (max_selection_weight < pOVar13->m_weight) {
        bVar14 = true;
        iVar7 = 3;
      }
      else {
        lVar3 = *(long *)((long)&pOVar13->m_value +
                         (ulong)((pOVar13->m_subtract_fee_outputs ^ 1) << 5));
        if (lVar3 == *nTargetValue) {
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    ((SelectionResult *)(local_1b8 + 0x70),&pOVar13->m_outputs);
          bVar2 = pOVar13->m_subtract_fee_outputs;
          local_148.m_use_effective = (bool)(bVar2 ^ 1);
          local_148.m_weight = local_148.m_weight + pOVar13->m_weight;
          if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) {
            local_1b8._8_4_ = _S_red;
            local_1b8._16_8_ = (_Base_ptr)0x0;
            puVar4 = local_1b8;
            local_1b8._24_8_ = puVar6;
            local_1b8._32_8_ = puVar6;
          }
          else {
            local_1b8._8_4_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            local_1b8._16_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_1b8._24_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1b8._32_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
            _M_parent = (_Base_ptr)puVar6;
            local_1b8._40_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((long)&local_148 + 8);
            puVar4 = local_1b8 + 0x70;
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          *(undefined8 *)(puVar4 + 0x28) = 0;
          local_1b8._56_8_ = CONCAT62(local_148._58_6_,CONCAT11(bVar2,local_148.m_algo)) ^ 0x100;
          local_1b8._72_8_ =
               CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._9_7_,
                        local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
          local_1b8._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
          local_1b8._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
          local_1b8._104_8_ = local_148.bump_fee_group_discount;
          local_1b8._88_8_ = local_148.m_selections_evaluated;
          local_1b8._64_8_ =
               local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          local_1b8._48_8_ = local_148.m_target;
          if ((_Base_ptr)local_1b8._16_8_ == (_Base_ptr)0x0) {
            *(undefined4 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 0;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
                 p_Var1;
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
                 p_Var1;
            p_Var5 = &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>;
          }
          else {
            *(undefined4 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
                 local_1b8._8_4_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 local_1b8._16_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
                 local_1b8._24_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
                 local_1b8._32_8_;
            *(_Base_ptr *)(local_1b8._16_8_ + 8) = p_Var1;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
                 local_1b8._40_8_;
            local_1b8._16_8_ = (_Base_ptr)0x0;
            local_1b8._24_8_ = puVar6;
            local_1b8._32_8_ = puVar6;
            p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_1b8;
          }
          *(undefined8 *)
           ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
               local_1b8._96_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
               local_1b8._104_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
               local_1b8._80_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
               local_1b8._88_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
               local_1b8._64_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
               local_1b8._72_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
               local_1b8._48_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
               local_1b8._56_8_;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
               '\x01';
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)local_1b8);
          iVar7 = 1;
        }
        else {
          if (lVar3 < *nTargetValue + change_target) {
            std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                      (&local_418,pOVar13);
            local_470 = local_470 +
                        *(long *)((long)&pOVar13->m_value +
                                 (ulong)((pOVar13->m_subtract_fee_outputs ^ 1) << 5));
          }
          else if ((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_engaged != true) ||
                  (lVar3 < *(long *)((long)&local_3f8.
                                            super__Optional_base<wallet::OutputGroup,_false,_false>.
                                            _M_payload.
                                            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                            .super__Optional_payload_base<wallet::OutputGroup>.
                                            _M_payload +
                                    (ulong)((local_3f8.
                                             super__Optional_base<wallet::OutputGroup,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                             .super__Optional_payload_base<wallet::OutputGroup>.
                                             _M_payload._M_value.m_subtract_fee_outputs ^ 1) << 5) +
                                    0x20))) {
            std::optional<wallet::OutputGroup>::operator=(&local_3f8,pOVar13);
          }
          iVar7 = 0;
        }
      }
      if ((iVar7 != 3) && (iVar7 != 0)) break;
      pOVar13 = pOVar13 + 1;
      bVar17 = pOVar13 == pOVar12;
    } while (!bVar17);
  }
  pOVar13 = local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_438.field_2._8_8_ = local_470;
  if (!bVar17) goto LAB_00b810cf;
  if (local_470 == *nTargetValue) {
    if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pOVar12 = local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  ((SelectionResult *)(local_1b8 + 0x70),&pOVar12->m_outputs);
        local_148.m_use_effective = (bool)(pOVar12->m_subtract_fee_outputs ^ 1);
        local_148.m_weight = local_148.m_weight + pOVar12->m_weight;
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 != pOVar13);
    }
    if (max_selection_weight < local_148.m_weight) {
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)(local_1b8 + 0x70));
      if (local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = false;
      }
      local_148.m_weight = 0;
      bVar14 = true;
      goto LAB_00b8073c;
    }
    puVar6 = local_228 + 8;
    if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      puVar4 = local_228;
      local_228._8_4_ = _S_red;
      local_228._16_8_ = (_Base_ptr)0x0;
      local_228._24_8_ = puVar6;
      local_228._32_8_ = puVar6;
    }
    else {
      puVar4 = local_1b8 + 0x70;
      local_228._8_4_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_228._16_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_228._24_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_228._32_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
      _M_parent = (_Base_ptr)puVar6;
      local_228._40_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((long)&local_148 + 8);
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    *(undefined8 *)(puVar4 + 0x28) = 0;
    local_228._56_8_ =
         CONCAT62(local_148._58_6_,CONCAT11(local_148.m_use_effective,local_148.m_algo));
    local_228._72_8_ =
         CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_228._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
    local_228._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
    local_228._104_8_ = local_148.bump_fee_group_discount;
    local_228._88_8_ = local_148.m_selections_evaluated;
    local_228._64_8_ =
         local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_228._48_8_ = local_148.m_target;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if ((_Base_ptr)local_228._16_8_ == (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var1
      ;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var1
      ;
      p_Var5 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
    }
    else {
      p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_228;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_228._8_4_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           local_228._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
           local_228._24_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           local_228._32_8_;
      *(_Base_ptr *)(local_228._16_8_ + 8) = p_Var1;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_228._40_8_;
      local_228._16_8_ = (_Base_ptr)0x0;
      local_228._24_8_ = puVar6;
      local_228._32_8_ = puVar6;
    }
    *(undefined8 *)
     ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_228._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_228._104_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_228._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_228._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_228._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_228._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_228._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_228._56_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_228;
  }
  else {
LAB_00b8073c:
    pOVar12 = local_418.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pOVar13 = local_418.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (*nTargetValue <= local_470) {
      if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar15 = (long)local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (lVar15 >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (local_418.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_418.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x681) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar13,pOVar12);
        }
        else {
          pOVar16 = pOVar13 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar13,pOVar16);
          for (; pOVar16 != pOVar12; pOVar16 = pOVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                      (pOVar16);
          }
        }
      }
      args_1 = &local_438;
      local_438._M_dataplus._M_p = (pointer)0x0;
      local_438._M_string_length = 0;
      local_438.field_2._M_allocated_capacity = 0;
      ApproximateBestSubset
                (rng,&local_418,(CAmount *)(local_438.field_2._M_local_buf + 8),nTargetValue,
                 (vector<char,_std::allocator<char>_> *)args_1,&local_440,max_selection_weight,
                 in_stack_fffffffffffffb60);
      if ((local_440 != *nTargetValue) &&
         (paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(*nTargetValue + change_target), (long)paVar9 <= local_470)) {
        args_1 = &local_438;
        local_58._M_dataplus._M_p = (pointer)paVar9;
        ApproximateBestSubset
                  (rng,&local_418,(CAmount *)(local_438.field_2._M_local_buf + 8),
                   (CAmount *)&local_58,(vector<char,_std::allocator<char>_> *)args_1,&local_440,
                   max_selection_weight,in_stack_fffffffffffffb60);
      }
      if ((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
           super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) &&
         ((local_440 != *nTargetValue && local_440 < change_target + *nTargetValue ||
          (*(long *)((long)&local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                            super__Optional_payload_base<wallet::OutputGroup>._M_payload +
                    (ulong)((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                             m_subtract_fee_outputs ^ 1) << 5) + 0x20) <= local_440)))) {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  ((SelectionResult *)(local_1b8 + 0x70),
                   (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)&local_3f8);
        local_148.m_use_effective =
             (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                    m_subtract_fee_outputs ^ 1);
        local_148.m_weight =
             local_148.m_weight +
             local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
LAB_00b80cd1:
        puVar6 = local_388 + 8;
        if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          puVar4 = local_388;
          local_388._8_4_ = _S_red;
          local_388._16_8_ = (_Base_ptr)0x0;
          local_388._24_8_ = puVar6;
          local_388._32_8_ = puVar6;
        }
        else {
          puVar4 = local_1b8 + 0x70;
          local_388._8_4_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_388._16_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_388._24_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_388._32_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = (_Base_ptr)puVar6;
          local_388._40_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_148 + 8);
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *(undefined8 *)(puVar4 + 0x28) = 0;
        local_388._56_8_ =
             CONCAT62(local_148._58_6_,CONCAT11(local_148.m_use_effective,local_148.m_algo));
        local_388._72_8_ =
             CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._9_7_,
                      local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
        local_388._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
        local_388._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
        local_388._104_8_ = local_148.bump_fee_group_discount;
        local_388._88_8_ = local_148.m_selections_evaluated;
        local_388._64_8_ =
             local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_388._48_8_ = local_148.m_target;
        p_Var1 = (_Base_ptr)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
        if ((_Base_ptr)local_388._16_8_ == (_Base_ptr)0x0) {
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               p_Var1;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               p_Var1;
          p_Var5 = &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::SelectionResult>;
        }
        else {
          p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_388;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
               local_388._8_4_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
               local_388._16_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               local_388._24_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               local_388._32_8_;
          *(_Base_ptr *)(local_388._16_8_ + 8) = p_Var1;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
               local_388._40_8_;
          local_388._16_8_ = (_Base_ptr)0x0;
          local_388._24_8_ = puVar6;
          local_388._32_8_ = puVar6;
        }
        *(undefined8 *)
         ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
             local_388._96_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
             local_388._104_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
             local_388._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
             local_388._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
             local_388._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
             local_388._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
             local_388._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
             local_388._56_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
             '\x01';
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)local_388);
      }
      else {
        if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar8 = 0;
          uVar11 = 1;
          do {
            if (local_438._M_dataplus._M_p[uVar8] != '\0') {
              pOVar13 = local_418.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar8;
              SelectionResult::
              InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                        ((SelectionResult *)(local_1b8 + 0x70),&pOVar13->m_outputs);
              local_148.m_use_effective = (bool)(pOVar13->m_subtract_fee_outputs ^ 1);
              local_148.m_weight = local_148.m_weight + pOVar13->m_weight;
            }
            uVar8 = ((long)local_418.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_418.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
            bVar17 = uVar11 <= uVar8;
            lVar3 = uVar8 - uVar11;
            uVar8 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar17 && lVar3 != 0);
        }
        if (local_148.m_weight <= max_selection_weight) {
LAB_00b80acf:
          pLVar10 = LogInstance();
          bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar10,SELECTCOINS,Debug);
          if (bVar17) {
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2f8,"Coin selection best subset: ","");
            if (local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar8 = 0;
              uVar11 = 1;
              do {
                if (local_438._M_dataplus._M_p[uVar8] != '\0') {
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar8 * 0x68);
                  FormatMoney_abi_cxx11_
                            (&local_78,
                             local_418.
                             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar8].m_value);
                  tinyformat::format<std::__cxx11::string>
                            (&local_58,(tinyformat *)0x114b6df,(char *)&local_78,args);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_2f8,local_58._M_dataplus._M_p,local_58._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                }
                uVar8 = ((long)local_418.
                               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_418.
                               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
                bVar17 = uVar11 <= uVar8;
                lVar3 = uVar8 - uVar11;
                uVar8 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar17 && lVar3 != 0);
            }
            pLVar10 = LogInstance();
            bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar10,SELECTCOINS,Debug);
            if (bVar17) {
              FormatMoney_abi_cxx11_(&local_318,local_440);
              pLVar10 = LogInstance();
              bVar17 = BCLog::Logger::Enabled(pLVar10);
              if (bVar17) {
                local_58._M_string_length = 0;
                local_58.field_2._M_local_buf[0] = '\0';
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_78,(tinyformat *)"%stotal %s\n",(char *)&local_2f8,&local_318,
                           args_1);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_58,&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                pLVar10 = LogInstance();
                local_78._M_dataplus._M_p = (pointer)0x61;
                local_78._M_string_length = 0x111ddba;
                source_file._M_str._0_4_ = 0x111ddba;
                source_file._M_len = 0x61;
                source_file._M_str._4_4_ = 0;
                str._M_str = local_58._M_dataplus._M_p;
                str._M_len = local_58._M_string_length;
                logging_function._M_str = "KnapsackSolver";
                logging_function._M_len = 0xe;
                BCLog::Logger::LogPrintStr
                          (pLVar10,str,logging_function,source_file,0x2e7,SELECTCOINS,Debug);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                           local_58.field_2._M_local_buf[0]) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          goto LAB_00b80cd1;
        }
        if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
            super__Optional_payload_base<wallet::OutputGroup>._M_engaged != false) {
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)(local_1b8 + 0x70));
          if (local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == true) {
            local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged = false;
          }
          local_148.m_weight = 0;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    ((SelectionResult *)(local_1b8 + 0x70),
                     (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)&local_3f8);
          local_148.m_use_effective =
               (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                      super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                      m_subtract_fee_outputs ^ 1);
          local_148.m_weight =
               local_148.m_weight +
               local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
               super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
               super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
          goto LAB_00b80acf;
        }
        ErrorMaxWeightExceeded();
      }
      if (local_438._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_438._M_dataplus._M_p,
                        local_438.field_2._M_allocated_capacity - (long)local_438._M_dataplus._M_p);
      }
      goto LAB_00b810cf;
    }
    if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
        super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) {
      if (bVar14) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_248 = &local_238;
        uStack_257 = 0;
        uStack_250 = 0;
        uStack_24f = 0;
        uStack_24b = 0;
        uStack_249 = 0;
        uStack_230 = 0;
        local_2d8._112_8_ = &local_258;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x11) = 0;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x19) = 0;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1d) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1f) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        uStack_260 = 0;
        local_258 = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        uStack_240 = 0;
        local_238 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
      }
      goto LAB_00b810cf;
    }
    SelectionResult::
    InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
              ((SelectionResult *)(local_1b8 + 0x70),
               (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)&local_3f8);
    local_148.m_use_effective =
         (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                m_subtract_fee_outputs ^ 1);
    local_148.m_weight =
         local_148.m_weight +
         local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
         super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
         super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
    puVar6 = local_2d8 + 8;
    if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      puVar4 = local_2d8;
      local_2d8._8_4_ = _S_red;
      local_2d8._16_8_ = (_Base_ptr)0x0;
      local_2d8._24_8_ = puVar6;
      local_2d8._32_8_ = puVar6;
    }
    else {
      puVar4 = local_1b8 + 0x70;
      local_2d8._8_4_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_2d8._16_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_2d8._24_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2d8._32_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
      _M_parent = (_Base_ptr)puVar6;
      local_2d8._40_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((long)&local_148 + 8);
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    *(undefined8 *)(puVar4 + 0x28) = 0;
    local_2d8._56_8_ =
         CONCAT62(local_148._58_6_,
                  CONCAT11(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                           super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                           m_subtract_fee_outputs,local_148.m_algo)) ^ 0x100;
    local_2d8._72_8_ =
         CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_2d8._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
    local_2d8._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
    local_2d8._104_8_ = local_148.bump_fee_group_discount;
    local_2d8._88_8_ = local_148.m_selections_evaluated;
    local_2d8._64_8_ =
         local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_2d8._48_8_ = local_148.m_target;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if ((_Base_ptr)local_2d8._16_8_ == (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var1
      ;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var1
      ;
      p_Var5 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
    }
    else {
      p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_2d8;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_2d8._8_4_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           local_2d8._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
           local_2d8._24_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           local_2d8._32_8_;
      *(_Base_ptr *)(local_2d8._16_8_ + 8) = p_Var1;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_2d8._40_8_;
      local_2d8._16_8_ = (_Base_ptr)0x0;
      local_2d8._24_8_ = puVar6;
      local_2d8._32_8_ = puVar6;
    }
    *(undefined8 *)
     ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_2d8._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_2d8._104_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_2d8._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_2d8._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_2d8._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_2d8._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_2d8._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_2d8._56_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_2d8;
  }
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(this);
LAB_00b810cf:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_418);
  if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
      super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) {
    local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
    super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    ~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)&local_3f8);
  }
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)(local_1b8 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}